

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

int delwind(int f,int n)

{
  char *pcVar1;
  buffer *pbVar2;
  mgwin *pmVar3;
  mgwin *__ptr;
  int iVar4;
  mgwin *pmVar5;
  
  __ptr = curwp;
  iVar4 = shrinkwind(8,curwp->w_ntrows + 1);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    pbVar2 = __ptr->w_bufp;
    pcVar1 = &pbVar2->b_nwnd;
    *pcVar1 = *pcVar1 + -1;
    if (*pcVar1 == '\0') {
      pbVar2->b_dotp = __ptr->w_dotp;
      pbVar2->b_doto = __ptr->w_doto;
      pbVar2->b_markp = __ptr->w_markp;
      pbVar2->b_marko = __ptr->w_marko;
      pbVar2->b_dotline = __ptr->w_dotline;
      pbVar2->b_markline = __ptr->w_markline;
    }
    curwp = (__ptr->w_list).l_p.l_wp;
    pmVar3 = curwp;
    if ((__ptr != wheadp) && (pmVar3 = wheadp, curwp == (mgwin *)0x0)) {
      curwp = wheadp;
    }
    wheadp = pmVar3;
    curbp = curwp->w_bufp;
    pmVar3 = wheadp;
    do {
      pmVar5 = pmVar3;
      if (pmVar5 == (mgwin *)0x0) goto LAB_0011b099;
      pmVar3 = (pmVar5->w_list).l_p.l_wp;
    } while (pmVar3 != __ptr);
    (pmVar5->w_list).l_p = (__ptr->w_list).l_p;
LAB_0011b099:
    free(__ptr);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int
delwind(int f, int n)
{
	struct mgwin	*wp, *nwp;

	wp = curwp;		/* Cheap...		 */

	/* shrinkwind returning false means only one window... */
	if (shrinkwind(FFRAND, wp->w_ntrows + 1) == FALSE)
		return (FALSE);
	if (--wp->w_bufp->b_nwnd == 0) {
		wp->w_bufp->b_dotp = wp->w_dotp;
		wp->w_bufp->b_doto = wp->w_doto;
		wp->w_bufp->b_markp = wp->w_markp;
		wp->w_bufp->b_marko = wp->w_marko;
		wp->w_bufp->b_dotline = wp->w_dotline;
		wp->w_bufp->b_markline = wp->w_markline;
	}

	/* since shrinkwind did't crap out, we know we have a second window */
	if (wp == wheadp)
		wheadp = curwp = wp->w_wndp;
	else if ((curwp = wp->w_wndp) == NULL)
		curwp = wheadp;
	curbp = curwp->w_bufp;
	for (nwp = wheadp; nwp != NULL; nwp = nwp->w_wndp)
		if (nwp->w_wndp == wp) {
			nwp->w_wndp = wp->w_wndp;
			break;
		}
	free(wp);
	return (TRUE);
}